

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O2

void __thiscall Assimp::ASE::Parser::ParseLV2MaterialBlock(Parser *this,Material *mat)

{
  ai_real *paVar1;
  bool bVar2;
  ai_real aVar3;
  byte *pbVar4;
  byte bVar5;
  ulong __new_size;
  aiColor3D *apOut;
  Texture *map;
  int iVar6;
  string *out;
  allocator<char> local_3ad;
  uint iNumSubMaterials;
  vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_> *local_3a8;
  ulong local_3a0;
  Texture *local_398;
  Texture *local_390;
  Texture *local_388;
  Texture *local_380;
  Texture *local_378;
  Texture *local_370;
  Texture *local_368;
  ai_real *local_360;
  ai_real *local_358;
  string *local_350;
  ai_real *local_348;
  aiColor3D *local_340;
  aiColor3D *local_338;
  string local_330;
  ai_real f;
  
  iNumSubMaterials = 0;
  local_390 = &(mat->super_Material).sTexBump;
  local_3a8 = &mat->avSubMaterials;
  local_398 = &(mat->super_Material).sTexShininess;
  local_388 = &(mat->super_Material).sTexEmissive;
  local_380 = &(mat->super_Material).sTexOpacity;
  local_378 = &(mat->super_Material).sTexSpecular;
  local_370 = &(mat->super_Material).sTexAmbient;
  local_368 = &(mat->super_Material).sTexDiffuse;
  local_360 = &(mat->super_Material).mShininessStrength;
  local_358 = &(mat->super_Material).mSpecularExponent;
  local_348 = &(mat->super_Material).mTransparency;
  local_340 = &(mat->super_Material).mSpecular;
  local_338 = &(mat->super_Material).mDiffuse;
  local_350 = &(mat->super_Material).mName;
  local_3a0 = 0;
  iVar6 = 0;
  out = local_350;
LAB_003e0053:
  do {
    while( true ) {
      pbVar4 = (byte *)this->filePtr;
      bVar5 = *pbVar4;
      if (bVar5 == 0x2a) break;
LAB_003e04e2:
      if ((bVar5 - 0xc < 2) || (bVar5 == 10)) {
        if (this->bLastWasEndLine != false) goto LAB_003e051f;
        this->iLineNumber = this->iLineNumber + 1;
        bVar2 = true;
      }
      else {
        if (bVar5 == 0x7b) {
          iVar6 = iVar6 + 1;
        }
        else if (bVar5 == 0x7d) {
          iVar6 = iVar6 + -1;
          if (iVar6 == 0) {
            this->filePtr = (char *)(pbVar4 + 1);
            SkipToNextToken(this);
            return;
          }
        }
        else if (bVar5 == 0) {
          LogError(this,"Encountered unexpected EOL while parsing a *MATERIAL chunk (Level 2)");
        }
LAB_003e051f:
        bVar2 = false;
      }
      this->bLastWasEndLine = bVar2;
      this->filePtr = (char *)(pbVar4 + 1);
    }
    this->filePtr = (char *)(pbVar4 + 1);
    bVar2 = TokenMatch<char_const>(&this->filePtr,"MATERIAL_NAME",0xd);
    if (bVar2) break;
    bVar2 = TokenMatch<char_const>(&this->filePtr,"MATERIAL_AMBIENT",0x10);
    if (!bVar2) {
      bVar2 = TokenMatch<char_const>(&this->filePtr,"MATERIAL_DIFFUSE",0x10);
      apOut = local_338;
      if ((bVar2) ||
         (bVar2 = TokenMatch<char_const>(&this->filePtr,"MATERIAL_SPECULAR",0x11), apOut = local_340
         , bVar2)) {
        ParseLV4MeshFloatTriple(this,&apOut->r);
        goto LAB_003e0053;
      }
      bVar2 = TokenMatch<char_const>(&this->filePtr,"MATERIAL_SHADING",0x10);
      if (bVar2) {
        bVar2 = TokenMatch<char_const>(&this->filePtr,"Blinn",5);
        if (bVar2) {
          (mat->super_Material).mShading = Blinn;
        }
        else {
          bVar2 = TokenMatch<char_const>(&this->filePtr,"Phong",5);
          if (bVar2) {
            (mat->super_Material).mShading = Phong;
          }
          else {
            bVar2 = TokenMatch<char_const>(&this->filePtr,"Flat",4);
            if (bVar2) {
              (mat->super_Material).mShading = Flat;
            }
            else {
              bVar2 = TokenMatch<char_const>(&this->filePtr,"Wire",4);
              if (!bVar2) {
                (mat->super_Material).mShading = Gouraud;
                goto LAB_003e0099;
              }
              (mat->super_Material).mShading = Wire;
            }
          }
        }
      }
      else {
        bVar2 = TokenMatch<char_const>(&this->filePtr,"MATERIAL_TRANSPARENCY",0x15);
        paVar1 = local_348;
        if (bVar2) {
          ParseLV4MeshFloat(this,local_348);
          *paVar1 = 1.0 - *paVar1;
          out = local_350;
        }
        else {
          bVar2 = TokenMatch<char_const>(&this->filePtr,"MATERIAL_SELFILLUM",0x12);
          if (bVar2) {
            f = 0.0;
            ParseLV4MeshFloat(this,&f);
            (mat->super_Material).mEmissive.r = f;
            (mat->super_Material).mEmissive.g = f;
            (mat->super_Material).mEmissive.b = f;
          }
          else {
            bVar2 = TokenMatch<char_const>(&this->filePtr,"MATERIAL_SHINE",0xe);
            paVar1 = local_358;
            if (bVar2) {
              ParseLV4MeshFloat(this,local_358);
              *paVar1 = *paVar1 * 15.0;
            }
            else {
              bVar2 = TokenMatch<char_const>(&this->filePtr,"MATERIAL_TWOSIDED",0x11);
              if (bVar2) {
                (mat->super_Material).mTwoSided = true;
              }
              else {
                bVar2 = TokenMatch<char_const>(&this->filePtr,"MATERIAL_SHINESTRENGTH",0x16);
                if (!bVar2) {
                  bVar2 = TokenMatch<char_const>(&this->filePtr,"MAP_DIFFUSE",0xb);
                  map = local_368;
                  if ((((!bVar2) &&
                       (bVar2 = TokenMatch<char_const>(&this->filePtr,"MAP_AMBIENT",0xb),
                       map = local_370, !bVar2)) &&
                      (bVar2 = TokenMatch<char_const>(&this->filePtr,"MAP_SPECULAR",0xc),
                      map = local_378, !bVar2)) &&
                     ((bVar2 = TokenMatch<char_const>(&this->filePtr,"MAP_OPACITY",0xb),
                      map = local_380, !bVar2 &&
                      (bVar2 = TokenMatch<char_const>(&this->filePtr,"MAP_SELFILLUM",0xd),
                      map = local_388, !bVar2)))) {
                    bVar2 = TokenMatch<char_const>(&this->filePtr,"MAP_BUMP",8);
                    __new_size = local_3a0;
                    if (bVar2) {
                      ParseLV3MapBlock(this,local_390);
                    }
                    bVar2 = TokenMatch<char_const>(&this->filePtr,"MAP_SHINESTRENGTH",0x11);
                    map = local_398;
                    if (!bVar2) {
                      bVar2 = TokenMatch<char_const>(&this->filePtr,"NUMSUBMTLS",10);
                      if (bVar2) {
                        ParseLV4MeshLong(this,&iNumSubMaterials);
                        __new_size = (ulong)iNumSubMaterials;
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_330,"INVALID SUBMATERIAL",&local_3ad);
                        ASE::Material::Material((Material *)&f,&local_330);
                        std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::
                        resize(local_3a8,__new_size,(value_type *)&f);
                        ASE::Material::~Material((Material *)&f);
                        std::__cxx11::string::~string((string *)&local_330);
                      }
                      bVar2 = TokenMatch<char_const>(&this->filePtr,"SUBMATERIAL",0xb);
                      local_3a0 = __new_size;
                      if (!bVar2) {
                        pbVar4 = (byte *)this->filePtr;
                        bVar5 = *pbVar4;
                        goto LAB_003e04e2;
                      }
                      f = 0.0;
                      ParseLV4MeshLong(this,(uint *)&f);
                      aVar3 = f;
                      if ((uint)(ai_real)__new_size <= (uint)f) {
                        LogWarning(this,"Out of range: submaterial index is too large");
                        aVar3 = (ai_real)((int)(ai_real)__new_size - 1);
                      }
                      ParseLV2MaterialBlock
                                (this,(local_3a8->
                                      super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                                      )._M_impl.super__Vector_impl_data._M_start + (uint)aVar3);
                      goto LAB_003e0053;
                    }
                  }
                  ParseLV3MapBlock(this,map);
                  goto LAB_003e0053;
                }
                ParseLV4MeshFloat(this,local_360);
              }
            }
          }
        }
      }
      goto LAB_003e0053;
    }
    ParseLV4MeshFloatTriple(this,&(mat->super_Material).mAmbient.r);
  } while( true );
  bVar2 = ParseString(this,out,"*MATERIAL_NAME");
  if (!bVar2) {
LAB_003e0099:
    SkipToNextToken(this);
  }
  goto LAB_003e0053;
}

Assistant:

void Parser::ParseLV2MaterialBlock(ASE::Material& mat)
{
    AI_ASE_PARSER_INIT();

    unsigned int iNumSubMaterials = 0;
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;
            if (TokenMatch(filePtr,"MATERIAL_NAME",13))
            {
                if (!ParseString(mat.mName,"*MATERIAL_NAME"))
                    SkipToNextToken();
                continue;
            }
            // ambient material color
            if (TokenMatch(filePtr,"MATERIAL_AMBIENT",16))
            {
                ParseLV4MeshFloatTriple(&mat.mAmbient.r);
                continue;
            }
            // diffuse material color
            if (TokenMatch(filePtr,"MATERIAL_DIFFUSE",16) )
            {
                ParseLV4MeshFloatTriple(&mat.mDiffuse.r);
                continue;
            }
            // specular material color
            if (TokenMatch(filePtr,"MATERIAL_SPECULAR",17))
            {
                ParseLV4MeshFloatTriple(&mat.mSpecular.r);
                continue;
            }
            // material shading type
            if (TokenMatch(filePtr,"MATERIAL_SHADING",16))
            {
                if (TokenMatch(filePtr,"Blinn",5))
                {
                    mat.mShading = Discreet3DS::Blinn;
                }
                else if (TokenMatch(filePtr,"Phong",5))
                {
                    mat.mShading = Discreet3DS::Phong;
                }
                else if (TokenMatch(filePtr,"Flat",4))
                {
                    mat.mShading = Discreet3DS::Flat;
                }
                else if (TokenMatch(filePtr,"Wire",4))
                {
                    mat.mShading = Discreet3DS::Wire;
                }
                else
                {
                    // assume gouraud shading
                    mat.mShading = Discreet3DS::Gouraud;
                    SkipToNextToken();
                }
                continue;
            }
            // material transparency
            if (TokenMatch(filePtr,"MATERIAL_TRANSPARENCY",21))
            {
                ParseLV4MeshFloat(mat.mTransparency);
                mat.mTransparency = ai_real( 1.0 ) - mat.mTransparency;
                continue;
            }
            // material self illumination
            if (TokenMatch(filePtr,"MATERIAL_SELFILLUM",18))
            {
                ai_real f = 0.0;
                ParseLV4MeshFloat(f);

                mat.mEmissive.r = f;
                mat.mEmissive.g = f;
                mat.mEmissive.b = f;
                continue;
            }
            // material shininess
            if (TokenMatch(filePtr,"MATERIAL_SHINE",14) )
            {
                ParseLV4MeshFloat(mat.mSpecularExponent);
                mat.mSpecularExponent *= 15;
                continue;
            }
            // two-sided material
            if (TokenMatch(filePtr,"MATERIAL_TWOSIDED",17) )
            {
                mat.mTwoSided = true;
                continue;
            }
            // material shininess strength
            if (TokenMatch(filePtr,"MATERIAL_SHINESTRENGTH",22))
            {
                ParseLV4MeshFloat(mat.mShininessStrength);
                continue;
            }
            // diffuse color map
            if (TokenMatch(filePtr,"MAP_DIFFUSE",11))
            {
                // parse the texture block
                ParseLV3MapBlock(mat.sTexDiffuse);
                continue;
            }
            // ambient color map
            if (TokenMatch(filePtr,"MAP_AMBIENT",11))
            {
                // parse the texture block
                ParseLV3MapBlock(mat.sTexAmbient);
                continue;
            }
            // specular color map
            if (TokenMatch(filePtr,"MAP_SPECULAR",12))
            {
                // parse the texture block
                ParseLV3MapBlock(mat.sTexSpecular);
                continue;
            }
            // opacity map
            if (TokenMatch(filePtr,"MAP_OPACITY",11))
            {
                // parse the texture block
                ParseLV3MapBlock(mat.sTexOpacity);
                continue;
            }
            // emissive map
            if (TokenMatch(filePtr,"MAP_SELFILLUM",13))
            {
                // parse the texture block
                ParseLV3MapBlock(mat.sTexEmissive);
                continue;
            }
            // bump map
            if (TokenMatch(filePtr,"MAP_BUMP",8))
            {
                // parse the texture block
                ParseLV3MapBlock(mat.sTexBump);
            }
            // specular/shininess map
            if (TokenMatch(filePtr,"MAP_SHINESTRENGTH",17))
            {
                // parse the texture block
                ParseLV3MapBlock(mat.sTexShininess);
                continue;
            }
            // number of submaterials
            if (TokenMatch(filePtr,"NUMSUBMTLS",10))
            {
                ParseLV4MeshLong(iNumSubMaterials);

                // allocate enough storage
                mat.avSubMaterials.resize(iNumSubMaterials, Material("INVALID SUBMATERIAL"));
            }
            // submaterial chunks
            if (TokenMatch(filePtr,"SUBMATERIAL",11))
            {

                unsigned int iIndex = 0;
                ParseLV4MeshLong(iIndex);

                if (iIndex >= iNumSubMaterials)
                {
                    LogWarning("Out of range: submaterial index is too large");
                    iIndex = iNumSubMaterials-1;
                }

                // get a reference to the material
                Material& sMat = mat.avSubMaterials[iIndex];

                // parse the material block
                ParseLV2MaterialBlock(sMat);
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("2","*MATERIAL");
    }
}